

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O2

bool TryGetComponentType(Component *component,
                        unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *componentTypes,string *line)

{
  char *__haystack;
  char *pcVar1;
  __node_base *p_Var2;
  
  p_Var2 = &(componentTypes->_M_h)._M_before_begin;
  __haystack = (line->_M_dataplus)._M_p;
  do {
    p_Var2 = p_Var2->_M_nxt;
    if (p_Var2 == (__node_base *)0x0) goto LAB_00131dbc;
    pcVar1 = strstr(__haystack,(char *)p_Var2[1]._M_nxt);
  } while (pcVar1 == (char *)0x0);
  std::__cxx11::string::_M_assign((string *)&component->type);
LAB_00131dbc:
  return p_Var2 != (__node_base *)0x0;
}

Assistant:

static bool TryGetComponentType(Component& component,
                                std::unordered_set<std::string> componentTypes,
                                const std::string& line)
{
  for (std::unordered_set<std::string>::const_iterator it = componentTypes.begin();
       it != componentTypes.end();
       ++it)
  {
    if (strstr(line.c_str(), it->c_str()))
    {
      component.type = *it;
      return true;
    }
  }
  return false;
}